

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O0

string * getCommand_abi_cxx11_(int socket_fd,pollfd *pollData,bool *msgFlags,int id)

{
  undefined8 *puVar1;
  long lVar2;
  ssize_t sVar3;
  string *local_228;
  string local_218 [32];
  string local_1f8 [32];
  undefined8 local_1d8;
  size_t spacePos;
  string local_1c8 [32];
  undefined4 local_1a8;
  allocator local_1a1;
  string local_1a0 [32];
  ulong local_180;
  size_t count;
  string *local_168;
  string *returns;
  int rv;
  int numbytes;
  string cmdString;
  char local_138 [8];
  char command [256];
  int id_local;
  bool *msgFlags_local;
  pollfd *pollData_local;
  string *psStack_10;
  int socket_fd_local;
  
  std::__cxx11::string::string((string *)&rv);
  returns._4_4_ = 0;
  returns._0_4_ = -1;
  puVar1 = (undefined8 *)operator_new__(0x48);
  *puVar1 = 2;
  local_168 = (string *)(puVar1 + 1);
  local_228 = (string *)local_168;
  do {
    std::__cxx11::string::string(local_228);
    local_228 = local_228 + 0x20;
  } while (local_228 != (string *)(puVar1 + 9));
  local_180 = 0;
  do {
    while( true ) {
      while( true ) {
        lVar2 = std::__cxx11::string::length();
        if (lVar2 != 0) {
          local_1d8 = std::__cxx11::string::find((char *)&rv,0x118219);
          std::__cxx11::string::substr((ulong)local_1f8,(ulong)&rv);
          std::__cxx11::string::operator=((string *)local_168,local_1f8);
          std::__cxx11::string::~string(local_1f8);
          std::__cxx11::string::substr((ulong)local_218,(ulong)&rv);
          std::__cxx11::string::operator=((string *)(local_168 + 0x20),local_218);
          std::__cxx11::string::~string(local_218);
          psStack_10 = local_168;
          goto LAB_0010ed6b;
        }
        returns._0_4_ = poll((pollfd *)pollData,1,500);
        if ((int)returns != -1) break;
        perror("Error wiht polling");
      }
      if ((int)returns != 0) break;
      if ((msgFlags[id] & 1U) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1a0,"msg",&local_1a1);
        std::__cxx11::string::operator=((string *)local_168,local_1a0);
        std::__cxx11::string::~string(local_1a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
        psStack_10 = local_168;
        goto LAB_0010ed6b;
      }
    }
    bzero(local_138,0x100);
    sVar3 = recv(socket_fd,local_138,0xff,0);
    returns._4_4_ = (int)sVar3;
    if (returns._4_4_ == -1) {
      perror("recv");
      exit(1);
    }
    local_138[returns._4_4_] = '\0';
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c8,local_138,(allocator *)((long)&spacePos + 7));
    std::__cxx11::string::operator=((string *)&rv,local_1c8);
    std::__cxx11::string::~string(local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&spacePos + 7));
    local_180 = local_180 + 1;
  } while (local_180 < 0x10);
  psStack_10 = (string *)0x0;
LAB_0010ed6b:
  local_1a8 = 1;
  std::__cxx11::string::~string((string *)&rv);
  return psStack_10;
}

Assistant:

string* getCommand(int socket_fd, struct pollfd* pollData, bool* msgFlags, int id){

    char command[MAXDATASIZE];
    string cmdString;
    int numbytes = 0,rv = -1;
    string* returns = new string[2];


    //keep count of number of empty data recieved,
    // if more than max number was recieved, we know that the client has
    //  been disconnected
    size_t count = 0;

    while(cmdString.length() == 0){

        //check if there was something received on the socket,
        // if nothing received within .5 seconds then check if a message is
        // in the message queue
        rv = poll(pollData, 1, 500);


        if(rv == -1){
            perror("Error wiht polling");
        }
        // check if there was a time out, then check the message queue
        else if(rv == 0){
            if(msgFlags[id]){
                //propogate up that a message from another users has been receieved
                returns[0] = string("msg");
                return returns;
            }
        }
        // something was received on the socket connection
        else{
            //zero out the command just in case
            bzero(command,MAXDATASIZE);

            //get the message
            if ((numbytes = recv(socket_fd, command, MAXDATASIZE - 1, 0)) == -1) {
                perror("recv");
                exit(1);
            }

            //add null terminator to the received string
            command[numbytes] = '\0';

            //convert to c++ string
            cmdString = string(command);

            //check for the client disconnect
            count++;
            if(count > RECIEVE_MAX)
                return NULL;
        }
    }

    //finish parsing input and return
    size_t spacePos = cmdString.find(" ");
    returns[0] = cmdString.substr(0,spacePos);
    returns[1] = cmdString.substr(spacePos + 1);


    return returns;

}